

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

void __thiscall pbrt::Object::Object(Object *this,string *name)

{
  pointer pcVar1;
  
  (this->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__00169a50;
  (this->shapes).
  super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shapes).
  super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shapes).
  super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lightSources).
  super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lightSources).
  super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lightSources).
  super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->instances).
  super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->instances).
  super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->instances).
  super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->bounds).lower.x = 3.4028235e+38;
  (this->bounds).lower.y = 3.4028235e+38;
  *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
  (this->bounds).upper.y = -3.4028235e+38;
  (this->bounds).upper.z = -3.4028235e+38;
  return;
}

Assistant:

Object(const std::string &name="") : name(name) {
    }